

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIso3.c
# Opt level: O3

int Gia_Iso3Unique(Vec_Int_t *vSign)

{
  int iVar1;
  void *__dest;
  size_t sVar2;
  long lVar3;
  size_t __nmemb;
  int iVar4;
  
  iVar4 = vSign->nSize;
  __nmemb = (size_t)iVar4;
  if (__nmemb == 0) {
    iVar4 = 0;
  }
  else {
    __dest = malloc(__nmemb * 4);
    memcpy(__dest,vSign->pArray,__nmemb * 4);
    if (iVar4 < 2) {
      if (__dest == (void *)0x0) {
        return iVar4;
      }
    }
    else {
      qsort(__dest,__nmemb,4,Vec_IntSortCompare1);
      iVar4 = 1;
      sVar2 = 1;
      do {
        iVar1 = *(int *)((long)__dest + sVar2 * 4);
        if (iVar1 != *(int *)((long)__dest + sVar2 * 4 + -4)) {
          lVar3 = (long)iVar4;
          iVar4 = iVar4 + 1;
          *(int *)((long)__dest + lVar3 * 4) = iVar1;
        }
        sVar2 = sVar2 + 1;
      } while (__nmemb != sVar2);
    }
    free(__dest);
  }
  return iVar4;
}

Assistant:

int Gia_Iso3Unique( Vec_Int_t * vSign )
{
    int nUnique;
    Vec_Int_t * vCopy = Vec_IntDup( vSign );
    Vec_IntUniqify( vCopy );
    nUnique = Vec_IntSize(vCopy);
    Vec_IntFree( vCopy );
    return nUnique;
}